

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall ON_String::ToUTF8(ON_String *this,char *buffer,int buffer_length)

{
  int iVar1;
  int sUTF32_count;
  uint *puVar2;
  char *sUTF8;
  int utf8_count;
  uint error_mask;
  uint error_status;
  uint utf32_count;
  ON_wString local_58;
  undefined4 local_50;
  Encoding local_3c;
  undefined1 local_38 [4];
  Encoding e;
  ON_SimpleArray<unsigned_int> utf32;
  uint bad_utf32_count;
  int buffer_length_local;
  char *buffer_local;
  ON_String *utf8;
  
  utf32.m_capacity = buffer_length;
  if (buffer == (char *)0x0) {
    ON_String(this,&EmptyString);
    return (ON_String)(char *)this;
  }
  if (buffer_length == -1) {
    utf32.m_capacity = Length(buffer);
  }
  if (utf32.m_capacity < 1) {
    ON_String(this,&EmptyString);
    return (ON_String)(char *)this;
  }
  utf32.m_count = 0;
  ON_SimpleArray<unsigned_int>::ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_38);
  local_3c = ProbableEncoding(buffer,utf32.m_capacity);
  if (local_3c - ASCII < 2) {
    ON_String(this,buffer,utf32.m_capacity);
  }
  else if (local_3c == SloppyUTF8) {
    ON_String((ON_String *)&error_status,buffer,utf32.m_capacity);
    ON_wString::ON_wString(&local_58,(ON_String *)&error_status);
    ON_String(this,&local_58);
    ON_wString::~ON_wString(&local_58);
    ~ON_String((ON_String *)&error_status);
  }
  else {
    if (local_3c == BIG5andASCII) {
      utf32.m_count =
           Internal_Big5ToUTF32(buffer,utf32.m_capacity,(ON_SimpleArray<unsigned_int> *)local_38);
    }
    error_mask = ON_SimpleArray<unsigned_int>::UnsignedCount
                           ((ON_SimpleArray<unsigned_int> *)local_38);
    if ((error_mask != 0) && ((uint)(utf32.m_count << 1) <= error_mask)) {
      utf8_count = 0;
      puVar2 = ON_SimpleArray<unsigned_int>::Array((ON_SimpleArray<unsigned_int> *)local_38);
      iVar1 = ON_SimpleArray<unsigned_int>::Count((ON_SimpleArray<unsigned_int> *)local_38);
      iVar1 = ON_ConvertUTF32ToUTF8
                        (0,puVar2,iVar1,(char *)0x0,0,(uint *)&utf8_count,0xffffffff,0xfffd,
                         (ON__UINT32 **)0x0);
      if (0 < iVar1) {
        utf8_count = 0;
        ON_String(this);
        ReserveArray(this,(long)iVar1);
        SetLength(this,(long)iVar1);
        puVar2 = ON_SimpleArray<unsigned_int>::Array((ON_SimpleArray<unsigned_int> *)local_38);
        sUTF32_count = ON_SimpleArray<unsigned_int>::Count((ON_SimpleArray<unsigned_int> *)local_38)
        ;
        sUTF8 = Array(this);
        ON_ConvertUTF32ToUTF8
                  (0,puVar2,sUTF32_count,sUTF8,iVar1,(uint *)&utf8_count,0xffffffff,0xfffd,
                   (ON__UINT32 **)0x0);
        goto LAB_0085076e;
      }
    }
    ON_String(this,&EmptyString);
  }
LAB_0085076e:
  local_50 = 1;
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_38);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::EmptyString;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0)
    return ON_String::EmptyString;

  unsigned bad_utf32_count = 0;
  ON_SimpleArray<ON__UINT32> utf32;

  const ON_String::Encoding e = ON_String::ProbableEncoding(buffer, buffer_length);
  switch (e)
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::UTF8:
    return ON_String(buffer, buffer_length);
    break;

  case ON_String::Encoding::SloppyUTF8:
    // ON_String -> ON_wString cleans up the slop.
    // ON_wString -> ON_String converts the wchar_t UTF-X encoding to UTF-8.
    return ON_String(ON_wString(ON_String(buffer, buffer_length)));
    break;

  case ON_String::Encoding::BIG5andASCII:
    bad_utf32_count = Internal_Big5ToUTF32(buffer, buffer_length, utf32);
    break;

  default:
    break;
  }

  const unsigned utf32_count = utf32.UnsignedCount();
  if (utf32_count > 0 && utf32_count >= 2* bad_utf32_count)
  {
    unsigned int error_status = 0;
    const unsigned int error_mask = 0xFFFFFFFFu;
    const int utf8_count = ON_ConvertUTF32ToUTF8(
      false, // bTestByteOrder,
      utf32.Array(),
      utf32.Count(),
      nullptr, // char* sUTF8,
      0, // int sUTF8_count,
      &error_status,
      error_mask,
      ON_UnicodeCodePoint::ON_ReplacementCharacter,
      nullptr //const ON__UINT32 * *sNextUTF32
    );
    if (utf8_count > 0)
    {
      error_status = 0;
      ON_String utf8;
      utf8.ReserveArray(utf8_count);
      utf8.SetLength(utf8_count);
      ON_ConvertUTF32ToUTF8(
        false, // bTestByteOrder,
        utf32.Array(),
        utf32.Count(),
        utf8.Array(),
        utf8_count,
        &error_status,
        error_mask,
        ON_UnicodeCodePoint::ON_ReplacementCharacter,
        nullptr //const ON__UINT32 * *sNextUTF32
      );
      return utf8;
    }
  }

  return ON_String::EmptyString;
}